

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int UTF16BEToUTF8(uchar *out,int *outlen,uchar *inb,int *inlenb)

{
  int iVar1;
  int iVar2;
  uchar *processed;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  
  iVar4 = (int)out;
  iVar2 = *outlen;
  if ((*inlenb & 0x80000001U) == 1) {
    *inlenb = *inlenb - 1;
  }
  iVar1 = *inlenb;
  pbVar7 = inb;
  if (2 < iVar1 + 1U) {
    pbVar5 = out + iVar2;
    do {
      uVar8 = (uint)CONCAT11(*pbVar7,pbVar7[1]);
      pbVar6 = pbVar7 + 2;
      if ((*pbVar7 & 0xfc) == 0xd8) {
        if ((inb + (ulong)(uint)(iVar1 / 2) * 2 <= pbVar6) ||
           (bVar3 = *pbVar6, (bVar3 & 0xfc) != 0xdc)) {
          *outlen = (int)out - iVar4;
          *inlenb = (int)pbVar7 - (int)inb;
          return -2;
        }
        pbVar6 = pbVar7 + 4;
        uVar8 = (uVar8 & 0x3ff) * 0x400 + ((bVar3 & 3) << 8 | (uint)pbVar7[3]) + 0x10000;
      }
      if (pbVar5 <= out) break;
      if (uVar8 < 0x80) {
        iVar2 = -6;
        bVar3 = (byte)uVar8;
      }
      else if (uVar8 < 0x800) {
        bVar3 = (byte)(uVar8 >> 6) | 0xc0;
        iVar2 = 0;
      }
      else if (uVar8 < 0x10000) {
        bVar3 = (byte)(uVar8 >> 0xc) | 0xe0;
        iVar2 = 6;
      }
      else {
        bVar3 = (byte)(uVar8 >> 0x12) | 0xf0;
        iVar2 = 0xc;
      }
      pbVar7 = out + 1;
      *out = bVar3;
      out = pbVar7;
      if (0x7f < uVar8) {
        while (out < pbVar5) {
          *out = (byte)(uVar8 >> ((byte)iVar2 & 0x1f)) & 0x3f | 0x80;
          out = out + 1;
          if (iVar2 < 6) break;
          iVar2 = iVar2 + -6;
        }
      }
      pbVar7 = pbVar6;
    } while (pbVar6 < inb + (ulong)(uint)(iVar1 / 2) * 2);
  }
  *outlen = (int)out - iVar4;
  *inlenb = (int)pbVar7 - (int)inb;
  return *outlen;
}

Assistant:

static int
UTF16BEToUTF8(unsigned char* out, int *outlen,
            const unsigned char* inb, int *inlenb)
{
    unsigned char* outstart = out;
    const unsigned char* processed = inb;
    unsigned char* outend = out + *outlen;
    unsigned short* in = (unsigned short*) inb;
    unsigned short* inend;
    unsigned int c, d, inlen;
    unsigned char *tmp;
    int bits;

    if ((*inlenb % 2) == 1)
        (*inlenb)--;
    inlen = *inlenb / 2;
    inend= in + inlen;
    while (in < inend) {
	if (xmlLittleEndian) {
	    tmp = (unsigned char *) in;
	    c = *tmp++;
	    c = c << 8;
	    c = c | (unsigned int) *tmp;
	    in++;
	} else {
	    c= *in++;
	}
        if ((c & 0xFC00) == 0xD800) {    /* surrogates */
	    if (in >= inend) {           /* (in > inend) shouldn't happens */
		*outlen = out - outstart;
		*inlenb = processed - inb;
	        return(-2);
	    }
	    if (xmlLittleEndian) {
		tmp = (unsigned char *) in;
		d = *tmp++;
		d = d << 8;
		d = d | (unsigned int) *tmp;
		in++;
	    } else {
		d= *in++;
	    }
            if ((d & 0xFC00) == 0xDC00) {
                c &= 0x03FF;
                c <<= 10;
                c |= d & 0x03FF;
                c += 0x10000;
            }
            else {
		*outlen = out - outstart;
		*inlenb = processed - inb;
	        return(-2);
	    }
        }

	/* assertion: c is a single UTF-4 value */
        if (out >= outend)
	    break;
        if      (c <    0x80) {  *out++=  c;                bits= -6; }
        else if (c <   0x800) {  *out++= ((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
        else if (c < 0x10000) {  *out++= ((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
        else                  {  *out++= ((c >> 18) & 0x07) | 0xF0;  bits= 12; }

        for ( ; bits >= 0; bits-= 6) {
            if (out >= outend)
	        break;
            *out++= ((c >> bits) & 0x3F) | 0x80;
        }
	processed = (const unsigned char*) in;
    }
    *outlen = out - outstart;
    *inlenb = processed - inb;
    return(*outlen);
}